

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<int,true,std::allocator<unsigned_long>>::
view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (View<int,true,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          bit,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              sit,CoordinateOrder *internalCoordinateOrder,
          View<int,_true,_std::allocator<unsigned_long>_> *out)

{
  size_t sVar1;
  size_t offset;
  allocator_type local_39;
  size_t local_38;
  
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
  local_38 = 0;
  coordinatesToOffset<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (this,bit,&local_38);
  sVar1 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long_const*>
            ((View<int,true,std::allocator<unsigned_long>> *)out,sit,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(sit._M_current + sVar1),*(unsigned_long **)(this + 0x20),
             (pointer)(local_38 * 4 + *(long *)this),internalCoordinateOrder,&local_39);
  return;
}

Assistant:

inline void
View<T, isConst, A>::view
(
    BaseIterator bit,
    ShapeIterator sit,
    const CoordinateOrder& internalCoordinateOrder,
    View<T, isConst, A>& out
) const
{
    testInvariant();
    std::size_t offset = 0;
    coordinatesToOffset(bit, offset);
    out.assign(sit, sit+dimension(), geometry_.stridesBegin(),
        data_+offset, internalCoordinateOrder);
}